

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-test.cc
# Opt level: O0

void __thiscall mock_buffer<char>::mock_buffer(mock_buffer<char> *this,char *data,size_t capacity)

{
  size_t in_RDX;
  char *in_RSI;
  basic_buffer<char> *in_RDI;
  
  fmt::v5::internal::basic_buffer<char>::basic_buffer(in_RDI,(char *)0x0,0,0);
  in_RDI->_vptr_basic_buffer = (_func_int **)&PTR_grow_00264a70;
  testing::internal::FunctionMocker<void_(unsigned_long)>::FunctionMocker
            ((FunctionMocker<void_(unsigned_long)> *)in_RDI);
  fmt::v5::internal::basic_buffer<char>::set(in_RDI,in_RSI,in_RDX);
  return;
}

Assistant:

mock_buffer(T *data, std::size_t capacity) { this->set(data, capacity); }